

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O2

void __thiscall rw::Image::palettize(Image *this,int32 depth)

{
  uint32 dstStride;
  uint uVar1;
  uint8 *dstPixels;
  undefined4 in_register_00000034;
  uint8 *__ptr;
  ColorQuant quant;
  RGBA colors [256];
  
  ColorQuant::init(&quant,(EVP_PKEY_CTX *)CONCAT44(in_register_00000034,depth));
  ColorQuant::addImage(&quant,this);
  ColorQuant::makePalette(&quant,1 << ((byte)depth & 0x1f),colors);
  dstStride = this->width;
  allocLocation =
       "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/image.cpp line: 687"
  ;
  dstPixels = (uint8 *)(*DAT_00145dd8)(this->height * dstStride,0x30018);
  __ptr = dstPixels;
  ColorQuant::matchImage(&quant,dstPixels,dstStride,this);
  free(this,__ptr);
  this->depth = depth;
  uVar1 = (uint)depth >> 3;
  if (depth < 8) {
    uVar1 = 1;
  }
  this->bpp = uVar1;
  this->stride = dstStride;
  this->palette = (uint8 *)0x0;
  this->pixels = dstPixels;
  *(byte *)&this->flags = (byte)this->flags | 1;
  allocate(this);
  memcpy(this->palette,colors,(long)(4 << ((byte)depth & 0x1f)));
  ColorQuant::Node::destroy(quant.root);
  return;
}

Assistant:

void
Image::palettize(int32 depth)
{
	RGBA colors[256];
	ColorQuant quant;
	uint8 *newpixels;
	uint32 newstride;

	quant.init();
	quant.addImage(this);
	assert(depth <= 8);
	quant.makePalette(1<<depth, colors);

	newstride = this->width;
	newpixels = rwNewT(uint8, newstride*this->height, MEMDUR_EVENT | ID_IMAGE);
	// TODO: maybe do floyd-steinberg dithering?
	quant.matchImage(newpixels, newstride, this);

	this->free();
	this->depth = depth;
	this->bpp = depth < 8 ? 1 : depth/8;
	this->stride = newstride;
	this->pixels = nil;
	this->palette = nil;
	this->setPixels(newpixels);
	this->allocate();
	memcpy(this->palette, colors, 4*(1<<depth));

	quant.destroy();
}